

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

QSize __thiscall
QDockWidgetLayout::sizeFromContent(QDockWidgetLayout *this,QSize *content,bool floating)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidget *this_00;
  QStyle *pQVar5;
  QSize QVar6;
  QSize QVar7;
  Representation RVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Representation RVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  QMargins QVar25;
  int local_40;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  QVar6 = *content;
  RVar8 = QVar6.ht.m_i;
  if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
    iVar3 = minimumTitleWidth(this);
    RVar12.m_i = RVar8.m_i;
    if (RVar8.m_i < iVar3) {
      RVar12.m_i = iVar3;
    }
    iVar3 = (content->wd).m_i;
    local_40 = 0;
    if (0 < iVar3) {
      local_40 = iVar3;
    }
  }
  else {
    RVar12.m_i = 0;
    if (RVar8.m_i != 0 && -1 < (long)QVar6) {
      RVar12.m_i = RVar8.m_i;
    }
    local_40 = minimumTitleWidth(this);
    if (local_40 < QVar6.wd.m_i.m_i) {
      local_40 = QVar6.wd.m_i.m_i;
    }
  }
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  bVar2 = wmSupportsNativeWindowDeco();
  iVar3 = 0;
  bVar15 = false;
  if (bVar2 && floating) {
    bVar15 = (this->item_list).d.ptr[3] == (QLayoutItem *)0x0;
  }
  if (floating && !bVar15) {
    pQVar5 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x12,0,this_00);
    iVar3 = iVar3 * 2;
  }
  iVar4 = titleHeight(this);
  if (!bVar15) {
    local_40 = local_40 + iVar3;
    if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
      local_40 = local_40 + iVar4;
      RVar12.m_i = iVar3 + RVar12.m_i;
    }
    else {
      RVar12.m_i = iVar3 + RVar12.m_i + iVar4;
    }
  }
  iVar3 = (content->wd).m_i;
  iVar4 = (content->ht).m_i;
  QVar25 = QWidget::contentsMargins(this_00);
  QVar6 = QWidget::minimumSize(this_00);
  QVar7 = QWidget::maximumSize(this_00);
  lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
  iVar9 = 0xffffff;
  iVar13 = -1;
  iVar10 = -1;
  iVar14 = 0xffffff;
  if (lVar1 != 0) {
    iVar10 = QVar25.m_left.m_i.m_i + QVar25.m_right.m_i.m_i;
    iVar9 = QVar7.wd.m_i.m_i - iVar10;
    iVar14 = QVar25.m_top.m_i.m_i + QVar25.m_bottom.m_i.m_i;
    iVar13 = QVar6.wd.m_i.m_i - iVar10;
    auVar16 = ZEXT416(*(uint *)(lVar1 + 0x7c));
    auVar16 = pshuflw(auVar16,auVar16,0);
    auVar20 = ZEXT816(0x1000200040008);
    auVar24._0_12_ = auVar20._0_12_;
    auVar24._12_2_ = auVar20._6_2_;
    auVar24._14_2_ = auVar20._6_2_;
    auVar23._12_4_ = auVar24._12_4_;
    auVar23._0_10_ = auVar20._0_10_;
    auVar23._10_2_ = auVar20._4_2_;
    auVar22._10_6_ = auVar23._10_6_;
    auVar22._8_2_ = auVar20._4_2_;
    auVar22._0_8_ = 0x1000200040008;
    auVar21._8_8_ = auVar22._8_8_;
    auVar21._6_2_ = auVar20._2_2_;
    auVar21._4_2_ = auVar20._2_2_;
    auVar21._0_2_ = auVar20._0_2_;
    auVar21._2_2_ = auVar21._0_2_;
    auVar18._0_12_ = auVar16._0_12_;
    auVar18._12_2_ = auVar16._6_2_;
    auVar18._14_2_ = auVar16._6_2_;
    auVar17._12_4_ = auVar18._12_4_;
    auVar17._0_10_ = auVar16._0_10_;
    auVar17._10_2_ = auVar16._4_2_;
    auVar20._10_6_ = auVar17._10_6_;
    auVar20._0_8_ = auVar16._0_8_;
    auVar20._8_2_ = auVar16._4_2_;
    auVar19._8_8_ = auVar20._8_8_;
    auVar19._6_2_ = auVar16._2_2_;
    auVar19._4_2_ = auVar16._2_2_;
    auVar19._0_2_ = auVar16._0_2_;
    auVar19._2_2_ = auVar19._0_2_;
    auVar19 = auVar19 & auVar21;
    auVar16._0_2_ = -(ushort)(auVar19._0_2_ == 0);
    auVar16._2_2_ = -(ushort)(auVar19._2_2_ == 0);
    auVar16._4_2_ = -(ushort)(auVar19._4_2_ == 0);
    auVar16._6_2_ = -(ushort)(auVar19._6_2_ == 0);
    auVar16._8_2_ = -(ushort)(auVar19._8_2_ == 0);
    auVar16._10_2_ = -(ushort)(auVar19._10_2_ == 0);
    auVar16._12_2_ = -(ushort)(auVar19._12_2_ == 0);
    auVar16._14_2_ = -(ushort)(auVar19._14_2_ == 0);
    if (iVar13 == 0) {
      iVar13 = -1;
    }
    uVar11 = movmskps(iVar10,auVar16);
    if ((uVar11 & 8) != 0) {
      iVar13 = -1;
    }
    iVar10 = QVar6.ht.m_i.m_i - iVar14;
    if (iVar10 == 0) {
      iVar10 = -1;
    }
    if ((uVar11 & 4) != 0) {
      iVar10 = -1;
    }
    if ((uVar11 & 2) != 0) {
      iVar9 = 0xffffff;
    }
    iVar14 = QVar7.ht.m_i.m_i - iVar14;
    if ((uVar11 & 1) != 0) {
      iVar14 = 0xffffff;
    }
  }
  if (0xfffffe < RVar12.m_i) {
    RVar12.m_i = 0xffffff;
  }
  if (iVar4 < 0) {
    RVar12.m_i = -1;
  }
  RVar8.m_i = 0xffffff;
  if (local_40 < 0xffffff) {
    RVar8.m_i = local_40;
  }
  if (iVar3 < 0) {
    RVar8.m_i = -1;
  }
  if (iVar9 <= RVar8.m_i) {
    RVar8.m_i = iVar9;
  }
  if (iVar14 <= RVar12.m_i) {
    RVar12.m_i = iVar14;
  }
  if (RVar8.m_i <= iVar13) {
    RVar8.m_i = iVar13;
  }
  if (RVar12.m_i <= iVar10) {
    RVar12.m_i = iVar10;
  }
  QVar6.ht.m_i = RVar12.m_i;
  QVar6.wd.m_i = RVar8.m_i;
  return QVar6;
}

Assistant:

QSize QDockWidgetLayout::sizeFromContent(const QSize &content, bool floating) const
{
    QSize result = content;

    if (verticalTitleBar) {
        result.setHeight(qMax(result.height(), minimumTitleWidth()));
        result.setWidth(qMax(content.width(), 0));
    } else {
        result.setHeight(qMax(result.height(), 0));
        result.setWidth(qMax(content.width(), minimumTitleWidth()));
    }

    QDockWidget *w = qobject_cast<QDockWidget*>(parentWidget());
    const bool nativeDeco = nativeWindowDeco(floating);

    int fw = floating && !nativeDeco
            ? w->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, w)
            : 0;

    const int th = titleHeight();
    if (!nativeDeco) {
        if (verticalTitleBar)
            result += QSize(th + 2*fw, 2*fw);
        else
            result += QSize(2*fw, th + 2*fw);
    }

    result.setHeight(qMin(result.height(), (int) QWIDGETSIZE_MAX));
    result.setWidth(qMin(result.width(), (int) QWIDGETSIZE_MAX));

    if (content.width() < 0)
        result.setWidth(-1);
    if (content.height() < 0)
        result.setHeight(-1);

    const QMargins margins = w->contentsMargins();
    //we need to subtract the contents margin (it will be added by the caller)
    QSize min = w->minimumSize().shrunkBy(margins);
    QSize max = w->maximumSize().shrunkBy(margins);

    /* A floating dockwidget will automatically get its minimumSize set to the layout's
       minimum size + deco. We're *not* interested in this, we only take minimumSize()
       into account if the user set it herself. Otherwise we end up expanding the result
       of a calculation for a non-floating dock widget to a floating dock widget's
       minimum size + window decorations. */

    uint explicitMin = 0;
    uint explicitMax = 0;
    if (w->d_func()->extra != nullptr) {
        explicitMin = w->d_func()->extra->explicitMinSize;
        explicitMax = w->d_func()->extra->explicitMaxSize;
    }

    if (!(explicitMin & Qt::Horizontal) || min.width() == 0)
        min.setWidth(-1);
    if (!(explicitMin & Qt::Vertical) || min.height() == 0)
        min.setHeight(-1);

    if (!(explicitMax & Qt::Horizontal))
        max.setWidth(QWIDGETSIZE_MAX);
    if (!(explicitMax & Qt::Vertical))
        max.setHeight(QWIDGETSIZE_MAX);

    return result.boundedTo(max).expandedTo(min);
}